

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall
deci::ast_for_t::ast_for_t
          (ast_for_t *this,string *identifier,ast_item_t *start,ast_item_t *finish,ast_t *loop,
          ast_item_t *step)

{
  ast_item_t *step_local;
  ast_t *loop_local;
  ast_item_t *finish_local;
  ast_item_t *start_local;
  string *identifier_local;
  ast_for_t *this_local;
  
  ast_loop_t::ast_loop_t(&this->super_ast_loop_t);
  (this->super_ast_loop_t).super_ast_item_t._vptr_ast_item_t =
       (_func_int **)&PTR_EndLocationTag_abi_cxx11__0013a5d0;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->start = start;
  this->finish = finish;
  this->loop = loop;
  this->step = step;
  return;
}

Assistant:

ast_for_t::ast_for_t(const std::string& identifier, ast_item_t* start, ast_item_t* finish, ast_t* loop, ast_item_t* step)
    :identifier(identifier), start(start), finish(finish), loop(loop), step(step) {
    ;
  }